

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string_view w,uint32_t h)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  size_type sVar1;
  const_reference pvVar2;
  const_reference this_00;
  uint in_ECX;
  char *in_RDX;
  size_t in_RSI;
  long in_RDI;
  int32_t id;
  int32_t word2intsize;
  undefined1 local_51;
  undefined4 local_24;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10));
  local_24 = in_ECX % (uint)sVar1;
  while( true ) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)(int)local_24);
    local_51 = false;
    if (*pvVar2 != -1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)(int)local_24);
      this_00 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                          ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                           (in_RDI + 0x28),(long)*pvVar2);
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      __y._M_str = in_RDX;
      __y._M_len = in_RSI;
      local_51 = std::operator!=(__x,__y);
    }
    if (local_51 == false) break;
    local_24 = (int)(local_24 + 1) % (int)(uint)sVar1;
  }
  return local_24;
}

Assistant:

int32_t Dictionary::find(const std::string_view w, uint32_t h) const {
  int32_t word2intsize = word2int_.size();
  int32_t id = h % word2intsize;
  while (word2int_[id] != -1 && words_[word2int_[id]].word != w) {
    id = (id + 1) % word2intsize;
  }
  return id;
}